

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampPerAxisCase3D::iterate
          (TextureBorderClampPerAxisCase3D *this)

{
  GenericVec4 *pGVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  TextureFormat format;
  code *pcVar4;
  RenderContext *context;
  Texture3D *pTVar5;
  TestLog *pTVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  deUint32 dVar10;
  undefined4 extraout_EAX;
  uint uVar11;
  char *pcVar12;
  size_t sVar13;
  undefined4 extraout_var;
  RenderTarget *pRVar15;
  SeedBuilder *pSVar16;
  byte bVar17;
  Surface *pSVar18;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int iVar19;
  void *data;
  undefined1 auVar20 [16];
  string local_418;
  Surface renderedFrame;
  undefined1 local_3e0 [24];
  undefined2 local_3c8;
  undefined2 uStack_3c6;
  undefined1 local_3c4;
  LookupPrecision local_3b8;
  Surface reference;
  string local_370;
  string local_350;
  Surface errorMask;
  string borderColorString;
  _Alloc_hider local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8 [6];
  LodPrecision local_284;
  PixelFormat pixelFormat;
  ostringstream s;
  ChannelType CStack_264;
  size_type sStack_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  int local_248;
  undefined1 auStack_244 [76];
  ios_base local_1f8 [8];
  ios_base local_1f0 [276];
  ReferenceParams refParams;
  IVec4 colorBits;
  long lVar14;
  
  tcu::Surface::Surface(&renderedFrame,0x80,0x80);
  format = (((this->m_texture).super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>
             .m_data.ptr)->m_refTexture).super_TextureLevelPyramid.m_format;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&refParams,TEXTURETYPE_3D);
  glu::mapGLSampler((Sampler *)&s,this->m_sWrap,this->m_tWrap,this->m_rWrap,this->m_filter,
                    this->m_filter);
  refParams.sampler.compareChannel = local_248;
  refParams.sampler.magFilter = local_258._M_allocated_capacity._0_4_;
  refParams.sampler.lodThreshold = (float)local_258._M_allocated_capacity._4_4_;
  refParams.sampler.normalizedCoords = (bool)local_258._M_local_buf[8];
  refParams.sampler._25_3_ = local_258._9_3_;
  refParams.sampler.compare = local_258._12_4_;
  refParams.sampler.wrapS = _s;
  refParams.sampler.wrapT = CStack_264;
  refParams.sampler.wrapR = (undefined4)sStack_260;
  refParams.sampler.minFilter = sStack_260._4_4_;
  refParams.sampler.borderColor.v._0_8_ = *(undefined8 *)&(this->m_borderColor).v;
  refParams.sampler.borderColor.v._8_8_ = *(undefined8 *)((long)&(this->m_borderColor).v + 8);
  refParams.lodMode = LODMODE_EXACT;
  refParams.super_RenderParams.samplerType = glu::TextureTestUtil::getSamplerType(format);
  pGVar1 = &this->m_borderColor;
  refParams.super_RenderParams.colorScale.m_data._0_8_ = *(undefined8 *)(this->m_lookupScale).m_data
  ;
  refParams.super_RenderParams.colorScale.m_data._8_8_ =
       *(undefined8 *)((this->m_lookupScale).m_data + 2);
  refParams.super_RenderParams.colorBias.m_data._0_8_ = *(undefined8 *)(this->m_lookupBias).m_data;
  refParams.super_RenderParams.colorBias.m_data._8_8_ =
       *(undefined8 *)((this->m_lookupBias).m_data + 2);
  if (this->m_channelClass == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    local_3b8.coordBits.m_data._0_8_ = *(undefined8 *)&pGVar1->v;
    local_3b8._8_8_ = *(undefined8 *)((long)&(this->m_borderColor).v + 8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
    tcu::operator<<((ostream *)&s,(Vector<unsigned_int,_4> *)&local_3b8);
    std::__cxx11::stringbuf::str();
  }
  else if (this->m_channelClass == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
    local_3b8.coordBits.m_data._0_8_ = *(undefined8 *)&pGVar1->v;
    local_3b8._8_8_ = *(undefined8 *)((long)&(this->m_borderColor).v + 8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
    tcu::operator<<((ostream *)&s,(Vector<int,_4> *)&local_3b8);
    std::__cxx11::stringbuf::str();
  }
  else {
    local_3b8.coordBits.m_data._0_8_ = *(undefined8 *)&pGVar1->v;
    local_3b8._8_8_ = *(undefined8 *)((long)&(this->m_borderColor).v + 8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
    tcu::operator<<((ostream *)&s,(Vector<float,_4> *)&local_3b8);
    std::__cxx11::stringbuf::str();
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
  std::ios_base::~ios_base(local_1f8);
  _s = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&sStack_260);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&sStack_260,"Border color is ",0x10)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&sStack_260,borderColorString._M_dataplus._M_p,
             borderColorString._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&sStack_260,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&sStack_260,"Texture lookup bias: ",0x15);
  tcu::operator<<((ostream *)&sStack_260,&refParams.super_RenderParams.colorBias);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&sStack_260,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&sStack_260,"Texture lookup scale: ",0x16);
  tcu::operator<<((ostream *)&sStack_260,&refParams.super_RenderParams.colorScale);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&sStack_260,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&sStack_260,"Filter: ",8);
  pcVar12 = glu::getTextureFilterName(this->m_filter);
  if (pcVar12 == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)&sStack_260 + (int)*(undefined8 *)(sStack_260 - 0x18));
  }
  else {
    sVar13 = strlen(pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&sStack_260,pcVar12,sVar13);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&sStack_260,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&sStack_260,"Wrap mode: s = ",0xf);
  local_3b8.coordBits.m_data._0_8_ = glu::getRepeatModeName;
  local_3b8.coordBits.m_data[2] = this->m_sWrap;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_3b8,(ostream *)&sStack_260);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&sStack_260,", t = ",6);
  local_3e0._0_8_ = glu::getRepeatModeName;
  local_3e0._8_4_ = this->m_tWrap;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_3e0,(ostream *)&sStack_260);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&sStack_260,", r = ",6);
  local_418._M_dataplus._M_p = (pointer)glu::getRepeatModeName;
  local_418._M_string_length = CONCAT44(local_418._M_string_length._4_4_,this->m_rWrap);
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_418,(ostream *)&sStack_260);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&sStack_260,"\n",1);
  tcu::MessageBuilder::operator<<((MessageBuilder *)&s,(EndMessageToken *)&tcu::TestLog::EndMessage)
  ;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sStack_260);
  std::ios_base::~ios_base(local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)borderColorString._M_dataplus._M_p != &borderColorString.field_2) {
    operator_delete(borderColorString._M_dataplus._M_p,
                    borderColorString.field_2._M_allocated_capacity + 1);
  }
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar14 = CONCAT44(extraout_var,iVar9);
  pRVar15 = Context::getRenderTarget((this->super_TestCase).m_context);
  tcu::SeedBuilder::SeedBuilder((SeedBuilder *)&borderColorString);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s,
             (this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p,
             (allocator<char> *)&local_3b8);
  pSVar16 = tcu::operator<<((SeedBuilder *)&borderColorString,(string *)&s);
  pSVar16 = tcu::operator<<(pSVar16,this->m_texFormat);
  pSVar16 = tcu::operator<<(pSVar16,this->m_filter);
  pSVar16 = tcu::operator<<(pSVar16,this->m_sWrap);
  pSVar16 = tcu::operator<<(pSVar16,this->m_tWrap);
  pSVar16 = tcu::operator<<(pSVar16,this->m_rWrap);
  pSVar16 = tcu::operator<<(pSVar16,(((this->m_texture).
                                      super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>
                                      .m_data.ptr)->m_refTexture).m_width);
  pSVar16 = tcu::operator<<(pSVar16,(((this->m_texture).
                                      super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>
                                      .m_data.ptr)->m_refTexture).m_height);
  tcu::operator<<(pSVar16,(((this->m_texture).
                            super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>.
                            m_data.ptr)->m_refTexture).m_depth);
  if (_s != (TextureFormat)&local_258) {
    operator_delete((void *)_s,local_258._M_allocated_capacity + 1);
  }
  gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&borderColorString,pRVar15,0x80,0x80,
             (deUint32)borderColorString._M_dataplus._M_p);
  (**(code **)(lVar14 + 8))(0x84c0);
  (**(code **)(lVar14 + 0xb8))
            (0x806f,((this->m_texture).
                     super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>.m_data.
                    ptr)->m_glTexture);
  pcVar4 = *(code **)(lVar14 + 0x1360);
  dVar10 = glu::getGLWrapMode(refParams.sampler.wrapS);
  (*pcVar4)(0x806f,0x2802,dVar10);
  pcVar4 = *(code **)(lVar14 + 0x1360);
  dVar10 = glu::getGLWrapMode(refParams.sampler.wrapT);
  (*pcVar4)(0x806f,0x2803,dVar10);
  pcVar4 = *(code **)(lVar14 + 0x1360);
  dVar10 = glu::getGLWrapMode(refParams.sampler.wrapR);
  (*pcVar4)(0x806f,0x8072,dVar10);
  pcVar4 = *(code **)(lVar14 + 0x1360);
  dVar10 = glu::getGLFilterMode(refParams.sampler.minFilter);
  (*pcVar4)(0x806f,0x2801,dVar10);
  pcVar4 = *(code **)(lVar14 + 0x1360);
  dVar10 = glu::getGLFilterMode(refParams.sampler.magFilter);
  (*pcVar4)(0x806f,0x2800,dVar10);
  if ((ulong)this->m_channelClass < 5) {
    (**(code **)(lVar14 + *(long *)(&DAT_009733f8 + (ulong)this->m_channelClass * 8)))
              (0x806f,0x1004,pGVar1);
  }
  dVar10 = (**(code **)(lVar14 + 0x800))();
  glu::checkError(dVar10,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureBorderClampTests.cpp"
                  ,0x897);
  (**(code **)(lVar14 + 0x1a00))
            ((ulong)borderColorString._M_dataplus._M_p & 0xffffffff,
             borderColorString._M_dataplus._M_p._4_4_,
             borderColorString._M_string_length & 0xffffffff,
             borderColorString._M_string_length._4_4_);
  gls::TextureTestUtil::TextureRenderer::renderQuad
            ((this->m_renderer).
             super_UniqueBase<deqp::gls::TextureTestUtil::TextureRenderer,_de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>_>
             .m_data.ptr,0,
             (this->m_texCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&refParams.super_RenderParams);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar9 = (deUint32)borderColorString._M_dataplus._M_p;
  iVar19 = borderColorString._M_dataplus._M_p._4_4_;
  local_3b8.coordBits.m_data[0] = 8;
  local_3b8.coordBits.m_data[1] = 3;
  data = (void *)renderedFrame.m_pixels.m_cap;
  if (renderedFrame.m_pixels.m_cap != 0) {
    data = renderedFrame.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&s,(TextureFormat *)&local_3b8,renderedFrame.m_width,
             renderedFrame.m_height,1,data);
  glu::readPixels(context,iVar9,iVar19,(PixelBufferAccess *)&s);
  pRVar15 = Context::getRenderTarget((this->super_TestCase).m_context);
  pixelFormat.redBits = (pRVar15->m_pixelFormat).redBits;
  pixelFormat.greenBits = (pRVar15->m_pixelFormat).greenBits;
  pixelFormat.blueBits = (pRVar15->m_pixelFormat).blueBits;
  pixelFormat.alphaBits = (pRVar15->m_pixelFormat).alphaBits;
  colorBits.m_data[0] = -(uint)(0 < (int)(pixelFormat.redBits - 2U)) & pixelFormat.redBits - 2U;
  colorBits.m_data[1] = -(uint)(0 < (int)(pixelFormat.greenBits - 2U)) & pixelFormat.greenBits - 2U;
  colorBits.m_data[2] = -(uint)(0 < (int)(pixelFormat.blueBits - 2U)) & pixelFormat.blueBits - 2U;
  colorBits.m_data[3] = -(uint)(0 < (int)(pixelFormat.alphaBits - 2U)) & pixelFormat.alphaBits - 2U;
  tcu::Surface::Surface(&reference,renderedFrame.m_width,renderedFrame.m_height);
  tcu::Surface::Surface(&errorMask,renderedFrame.m_width,renderedFrame.m_height);
  local_284.rule = RULE_OPENGL;
  local_284.derivateBits = 0x12;
  local_3b8.coordBits.m_data[0] = 0x16;
  local_3b8.coordBits.m_data[1] = 0x16;
  local_3b8.coordBits.m_data[2] = 0x16;
  local_3b8.uvwBits.m_data[0] = 0x10;
  local_3b8.uvwBits.m_data[1] = 0x10;
  local_3b8.uvwBits.m_data[2] = 0x10;
  local_3b8.colorThreshold.m_data = (float  [4])ZEXT816(0);
  local_3b8.colorMask.m_data[0] = true;
  local_3b8.colorMask.m_data[1] = true;
  local_3b8.colorMask.m_data[2] = true;
  local_3b8.colorMask.m_data[3] = true;
  local_284.lodBits = 5;
  tcu::computeFixedPointThreshold((tcu *)&s,&colorBits);
  auVar7._8_8_ = sStack_260;
  auVar7._0_4_ = _s;
  auVar7._4_4_ = CStack_264;
  auVar8._8_4_ = refParams.super_RenderParams.colorScale.m_data[2];
  auVar8._12_4_ = refParams.super_RenderParams.colorScale.m_data[3];
  auVar8._0_4_ = refParams.super_RenderParams.colorScale.m_data[0];
  auVar8._4_4_ = refParams.super_RenderParams.colorScale.m_data[1];
  local_3b8.colorThreshold.m_data = (float  [4])divps(auVar7,auVar8);
  local_3b8.coordBits.m_data[0] = 0x14;
  local_3b8.coordBits.m_data[1] = 0x14;
  local_3b8.coordBits.m_data[2] = 0;
  local_3b8.uvwBits.m_data[0] = 5;
  local_3b8.uvwBits.m_data[1] = 5;
  local_3b8.uvwBits.m_data[2] = 0;
  auVar20._0_4_ = -(uint)(0 < pixelFormat.redBits);
  auVar20._4_4_ = -(uint)(0 < pixelFormat.greenBits);
  auVar20._8_4_ = -(uint)(0 < pixelFormat.blueBits);
  auVar20._12_4_ = -(uint)(0 < pixelFormat.alphaBits);
  uVar11 = movmskps(extraout_EAX,auVar20);
  bVar17 = (byte)uVar11;
  local_3b8.colorMask.m_data =
       (bool  [4])
       (uVar11 & 1 | (uint)((bVar17 & 2) >> 1) << 8 | (uint)((bVar17 & 4) >> 2) << 0x10 |
       (uint)(bVar17 >> 3) << 0x18);
  tcu::SurfaceAccess::SurfaceAccess((SurfaceAccess *)&s,&reference,&pixelFormat);
  pTVar5 = (this->m_texture).super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>.
           m_data.ptr;
  borderColorString._M_string_length = (size_type)(pTVar5->m_refTexture).m_view.m_levels;
  borderColorString._M_dataplus._M_p._0_4_ = (pTVar5->m_refTexture).m_view.m_numLevels;
  glu::TextureTestUtil::sampleTexture
            ((SurfaceAccess *)&s,(Texture3DView *)&borderColorString,
             (this->m_texCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&refParams);
  borderColorString._M_dataplus._M_p = (pointer)0x300000008;
  if (renderedFrame.m_pixels.m_cap != 0) {
    renderedFrame.m_pixels.m_cap = (size_t)renderedFrame.m_pixels.m_ptr;
  }
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&s,(TextureFormat *)&borderColorString,renderedFrame.m_width,
             renderedFrame.m_height,1,(void *)renderedFrame.m_pixels.m_cap);
  local_3e0._0_4_ = RGBA;
  local_3e0._4_4_ = UNORM_INT8;
  if (reference.m_pixels.m_cap != 0) {
    reference.m_pixels.m_cap = (size_t)reference.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&borderColorString,(TextureFormat *)local_3e0,reference.m_width,
             reference.m_height,1,(void *)reference.m_pixels.m_cap);
  local_418._M_dataplus._M_p = (pointer)0x300000008;
  if (errorMask.m_pixels.m_cap != 0) {
    errorMask.m_pixels.m_cap = (size_t)errorMask.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_3e0,(TextureFormat *)&local_418,errorMask.m_width,
             errorMask.m_height,1,(void *)errorMask.m_pixels.m_cap);
  pTVar5 = (this->m_texture).super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>.
           m_data.ptr;
  local_418._M_string_length = (size_type)(pTVar5->m_refTexture).m_view.m_levels;
  local_418._M_dataplus._M_p._0_4_ = (pTVar5->m_refTexture).m_view.m_numLevels;
  iVar9 = glu::TextureTestUtil::computeTextureLookupDiff
                    ((ConstPixelBufferAccess *)&s,(ConstPixelBufferAccess *)&borderColorString,
                     (PixelBufferAccess *)local_3e0,(Texture3DView *)&local_418,
                     (this->m_texCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,&refParams,&local_3b8,&local_284,
                     ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_watchDog);
  if (0 < iVar9) {
    _s = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&sStack_260);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&sStack_260,"ERROR: Result verification failed, got ",0x27);
    std::ostream::operator<<((ostringstream *)&sStack_260,iVar9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&sStack_260," invalid pixels!",0x10);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&s,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sStack_260);
    std::ios_base::~ios_base(local_1f0);
  }
  pTVar6 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_3e0._0_8_ = (long)local_3e0 + 0x10;
  local_3e0._16_8_ = 0x6552796669726556;
  _local_3c8 = 0x746c7573;
  local_3e0._8_8_ = 0xc;
  local_3c4 = '\0';
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  _s = S;
  CStack_264 = SNORM_INT8;
  local_418._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_418,(ulong)&s);
  local_418.field_2._M_allocated_capacity._0_4_ = _s;
  local_418.field_2._M_allocated_capacity._4_4_ = CStack_264;
  builtin_strncpy(local_418._M_dataplus._M_p,"Verification result",0x13);
  local_418._M_string_length._0_4_ = _s;
  local_418._M_string_length._4_4_ = CStack_264;
  local_418._M_dataplus._M_p[(long)_s] = '\0';
  tcu::LogImageSet::LogImageSet((LogImageSet *)&borderColorString,(string *)local_3e0,&local_418);
  tcu::TestLog::startImageSet(pTVar6,borderColorString._M_dataplus._M_p,local_2f8._M_p);
  paVar2 = &local_350.field_2;
  local_350.field_2._M_allocated_capacity = 0x64657265646e6552;
  local_350._M_string_length = 8;
  local_350.field_2._8_2_ = (ushort)(byte)local_350.field_2._M_local_buf[9] << 8;
  paVar3 = &local_370.field_2;
  local_370.field_2._M_allocated_capacity._0_6_ = 0x7265646e6552;
  local_370.field_2._M_allocated_capacity._6_2_ = 0x6465;
  local_370.field_2._8_2_ = 0x6920;
  local_370.field_2._10_4_ = 0x6567616d;
  local_370._M_string_length = 0xe;
  local_370.field_2._M_local_buf[0xe] = '\0';
  pSVar18 = &renderedFrame;
  local_370._M_dataplus._M_p = (pointer)paVar3;
  local_350._M_dataplus._M_p = (pointer)paVar2;
  tcu::LogImage::LogImage
            ((LogImage *)&s,&local_350,&local_370,pSVar18,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)&s,(int)pTVar6,__buf,(size_t)pSVar18);
  if ((undefined1 *)CONCAT44(auStack_244._0_4_,local_248) != auStack_244 + 0xc) {
    operator_delete((undefined1 *)CONCAT44(auStack_244._0_4_,local_248),
                    CONCAT44(auStack_244._16_4_,auStack_244._12_4_) + 1);
  }
  if (_s != (TextureFormat)&local_258) {
    operator_delete((void *)_s,local_258._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != paVar3) {
    operator_delete(local_370._M_dataplus._M_p,
                    CONCAT26(local_370.field_2._M_allocated_capacity._6_2_,
                             local_370.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != paVar2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_p != local_2e8) {
    operator_delete(local_2f8._M_p,local_2e8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)borderColorString._M_dataplus._M_p != &borderColorString.field_2) {
    operator_delete(borderColorString._M_dataplus._M_p,
                    borderColorString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  if (local_3e0._0_8_ != (long)local_3e0 + 0x10) {
    operator_delete((void *)local_3e0._0_8_,local_3e0._16_8_ + 1);
  }
  if (0 < iVar9) {
    pTVar6 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_3e0._0_8_ = (long)local_3e0 + 0x10;
    local_3e0._16_8_ = 0x636e657265666552;
    local_3c8 = 0x65;
    local_3e0._8_8_ = 9;
    local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
    borderColorString._M_dataplus._M_p = (pointer)0x15;
    local_418._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_418,(ulong)&borderColorString);
    local_418.field_2._M_allocated_capacity = (size_type)borderColorString._M_dataplus._M_p;
    builtin_strncpy(local_418._M_dataplus._M_p,"Ideal reference image",0x15);
    local_418._M_string_length = (size_type)borderColorString._M_dataplus._M_p;
    borderColorString._M_dataplus._M_p[(long)local_418._M_dataplus._M_p] = '\0';
    pSVar18 = &reference;
    tcu::LogImage::LogImage
              ((LogImage *)&s,(string *)local_3e0,&local_418,pSVar18,QP_IMAGE_COMPRESSION_MODE_BEST)
    ;
    iVar19 = (int)pTVar6;
    tcu::LogImage::write((LogImage *)&s,iVar19,__buf_00,(size_t)pSVar18);
    local_350.field_2._M_allocated_capacity = 0x73614d726f727245;
    local_350.field_2._8_2_ = 0x6b;
    local_350._M_string_length = 9;
    local_370.field_2._M_allocated_capacity._0_6_ = 0x20726f727245;
    local_370.field_2._M_allocated_capacity._6_2_ = 0x616d;
    local_370.field_2._8_2_ = 0x6b73;
    local_370._M_string_length = 10;
    local_370.field_2._10_4_ = local_370.field_2._10_4_ & 0xffffff00;
    pSVar18 = &errorMask;
    local_370._M_dataplus._M_p = (pointer)paVar3;
    local_350._M_dataplus._M_p = (pointer)paVar2;
    tcu::LogImage::LogImage
              ((LogImage *)&borderColorString,&local_350,&local_370,pSVar18,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&borderColorString,iVar19,__buf_01,(size_t)pSVar18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_p != local_2e8) {
      operator_delete(local_2f8._M_p,local_2e8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)borderColorString._M_dataplus._M_p != &borderColorString.field_2) {
      operator_delete(borderColorString._M_dataplus._M_p,
                      borderColorString.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != paVar3) {
      operator_delete(local_370._M_dataplus._M_p,
                      CONCAT26(local_370.field_2._M_allocated_capacity._6_2_,
                               local_370.field_2._M_allocated_capacity._0_6_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != paVar2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)CONCAT44(auStack_244._0_4_,local_248) != auStack_244 + 0xc) {
      operator_delete((undefined1 *)CONCAT44(auStack_244._0_4_,local_248),
                      CONCAT44(auStack_244._16_4_,auStack_244._12_4_) + 1);
    }
    if (_s != (TextureFormat)&local_258) {
      operator_delete((void *)_s,local_258._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p != &local_418.field_2) {
      operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
    }
    if (local_3e0._0_8_ != (long)local_3e0 + 0x10) {
      operator_delete((void *)local_3e0._0_8_,local_3e0._16_8_ + 1);
    }
  }
  tcu::TestLog::endImageSet(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log)
  ;
  pcVar12 = "Pass";
  if (iVar9 != 0) {
    pcVar12 = "Image verification failed";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(iVar9 != 0),
             pcVar12);
  tcu::Surface::~Surface(&errorMask);
  tcu::Surface::~Surface(&reference);
  tcu::Surface::~Surface(&renderedFrame);
  return STOP;
}

Assistant:

TextureBorderClampPerAxisCase3D::IterateResult TextureBorderClampPerAxisCase3D::iterate (void)
{
	tcu::Surface								renderedFrame		(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
	const glu::TextureTestUtil::ReferenceParams	samplerParams		= getSamplerParams();

	logParams(samplerParams);
	renderTo(renderedFrame, samplerParams);
	verifyImage(renderedFrame, samplerParams);

	return STOP;
}